

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O3

FT_Error TT_Get_MM_Blend(TT_Face face,FT_UInt num_coords,FT_Fixed *coords)

{
  uint uVar1;
  FT_Fixed *pFVar2;
  FT_Error FVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  GX_Blend pGVar7;
  
  pGVar7 = face->blend;
  if (pGVar7 == (GX_Blend)0x0) {
    FVar3 = TT_Get_MM_Var(face,(FT_MM_Var **)0x0);
    if (FVar3 != 0) {
      return FVar3;
    }
    pGVar7 = face->blend;
  }
  if ((pGVar7->coords == (FT_Fixed *)0x0) &&
     (FVar3 = tt_set_mm_blend(face,0,(FT_Fixed *)0x0,'\x01'), FVar3 != 0)) {
    return FVar3;
  }
  uVar1 = pGVar7->num_axis;
  uVar5 = (ulong)num_coords;
  if (uVar1 < num_coords) {
    uVar5 = (ulong)uVar1;
  }
  uVar6 = (uint)uVar5;
  if (face->doblend == '\0') {
    if (uVar6 != 0) {
      uVar5 = (ulong)uVar1;
      if (num_coords <= uVar1) {
        uVar5 = (ulong)num_coords;
      }
      memset(coords,0,uVar5 << 3);
      goto LAB_00253203;
    }
  }
  else if (uVar6 != 0) {
    pFVar2 = pGVar7->normalizedcoords;
    uVar4 = 0;
    do {
      coords[uVar4] = pFVar2[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
    goto LAB_00253203;
  }
  uVar6 = 0;
LAB_00253203:
  if (uVar6 < num_coords) {
    memset(coords + uVar6,0,(ulong)(~uVar6 + num_coords) * 8 + 8);
  }
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  TT_Get_MM_Blend( TT_Face    face,
                   FT_UInt    num_coords,
                   FT_Fixed*  coords )
  {
    FT_Error  error = FT_Err_Ok;
    GX_Blend  blend;
    FT_UInt   i, nc;


    if ( !face->blend )
    {
      if ( FT_SET_ERROR( TT_Get_MM_Var( face, NULL ) ) )
        return error;
    }

    blend = face->blend;

    if ( !blend->coords )
    {
      /* select default instance coordinates */
      /* if no instance is selected yet      */
      if ( FT_SET_ERROR( tt_set_mm_blend( face, 0, NULL, 1 ) ) )
        return error;
    }

    nc = num_coords;
    if ( num_coords > blend->num_axis )
    {
      FT_TRACE2(( "TT_Get_MM_Blend:"
                  " only using first %d of %d coordinates\n",
                  blend->num_axis, num_coords ));
      nc = blend->num_axis;
    }

    if ( face->doblend )
    {
      for ( i = 0; i < nc; i++ )
        coords[i] = blend->normalizedcoords[i];
    }
    else
    {
      for ( i = 0; i < nc; i++ )
        coords[i] = 0;
    }

    for ( ; i < num_coords; i++ )
      coords[i] = 0;

    return FT_Err_Ok;
  }